

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O1

int x509_get_entries(uchar **p,uchar *end,mbedtls_x509_crl_entry *entry)

{
  size_t *len;
  uchar *end_00;
  byte *pbVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  mbedtls_x509_crl_entry *pmVar7;
  int iVar8;
  int unaff_R12D;
  byte *pbVar9;
  uchar *end_01;
  size_t len2;
  size_t entry_len;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  iVar8 = 0;
  if (((*p != end) &&
      (iVar4 = mbedtls_asn1_get_tag(p,end,&local_38,0x30), iVar8 = 0, iVar4 != -0x62)) &&
     (iVar8 = iVar4, iVar4 == 0)) {
    end_01 = *p + local_38;
    iVar8 = unaff_R12D;
    do {
      if (end_01 <= *p) {
        return 0;
      }
      iVar4 = mbedtls_asn1_get_tag(p,end_01,&local_40,0x30);
      pmVar7 = entry;
      if (iVar4 == 0) {
        pbVar9 = *p;
        (entry->raw).tag = (uint)*pbVar9;
        (entry->raw).p = pbVar9;
        (entry->raw).len = local_40;
        pbVar9 = *p + local_40;
        iVar4 = mbedtls_x509_get_serial(p,pbVar9,&entry->serial);
        if (iVar4 != 0) goto LAB_001226b7;
        iVar5 = mbedtls_x509_get_time(p,pbVar9,&entry->revocation_date);
        iVar4 = 0;
        if (iVar5 == 0) {
          local_48 = 0;
          pbVar1 = *p;
          if (pbVar1 < pbVar9) {
            (entry->entry_ext).tag = (uint)*pbVar1;
            (entry->entry_ext).p = pbVar1;
            len = &(entry->entry_ext).len;
            iVar5 = mbedtls_asn1_get_tag(p,pbVar9,len,0x30);
            if (iVar5 == 0) {
              puVar6 = *p;
              sVar2 = *len;
              end_00 = puVar6 + sVar2;
              if (0 < (long)sVar2) {
                do {
                  iVar4 = mbedtls_asn1_get_tag(p,end_00,&local_48,0x30);
                  if (iVar4 != 0) {
                    iVar4 = iVar4 + -0x2500;
                    goto LAB_00122788;
                  }
                  puVar6 = *p + local_48;
                  *p = puVar6;
                } while (puVar6 < end_00);
              }
              iVar4 = -0x2566;
              if (puVar6 == end_00) {
                iVar4 = 0;
              }
            }
            else if (iVar5 == -0x62) {
              (entry->entry_ext).p = (uchar *)0x0;
            }
            else {
              iVar4 = iVar5 + -0x2500;
            }
          }
LAB_00122788:
          if (iVar4 != 0) goto LAB_001226b7;
          bVar3 = true;
          if (*p < end_01) {
            pmVar7 = (mbedtls_x509_crl_entry *)calloc(1,0x68);
            entry->next = pmVar7;
            if (pmVar7 == (mbedtls_x509_crl_entry *)0x0) {
              iVar4 = -0x2880;
              goto LAB_001226b7;
            }
          }
        }
        else {
          bVar3 = false;
          iVar8 = iVar5;
        }
      }
      else {
LAB_001226b7:
        bVar3 = false;
        pmVar7 = entry;
        iVar8 = iVar4;
      }
      entry = pmVar7;
    } while (bVar3);
  }
  return iVar8;
}

Assistant:

static int x509_get_entries( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_crl_entry *entry )
{
    int ret;
    size_t entry_len;
    mbedtls_x509_crl_entry *cur_entry = entry;

    if( *p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_tag( p, end, &entry_len,
            MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    end = *p + entry_len;

    while( *p < end )
    {
        size_t len2;
        const unsigned char *end2;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &len2,
                MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED ) ) != 0 )
        {
            return( ret );
        }

        cur_entry->raw.tag = **p;
        cur_entry->raw.p = *p;
        cur_entry->raw.len = len2;
        end2 = *p + len2;

        if( ( ret = mbedtls_x509_get_serial( p, end2, &cur_entry->serial ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_x509_get_time( p, end2,
                                   &cur_entry->revocation_date ) ) != 0 )
            return( ret );

        if( ( ret = x509_get_crl_entry_ext( p, end2,
                                            &cur_entry->entry_ext ) ) != 0 )
            return( ret );

        if( *p < end )
        {
            cur_entry->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl_entry ) );

            if( cur_entry->next == NULL )
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );

            cur_entry = cur_entry->next;
        }
    }

    return( 0 );
}